

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O2

CURLUcode parse_authority(Curl_URL *u,char *auth,size_t authlen,uint flags,dynbuf *host,
                         _Bool has_scheme)

{
  uint uVar1;
  uint uVar2;
  Curl_URL *pCVar3;
  CURLcode CVar4;
  int iVar5;
  CURLUcode CVar6;
  int iVar7;
  void *pvVar8;
  Curl_handler *pCVar9;
  char *pcVar10;
  char *pcVar11;
  size_t sVar12;
  bool bVar13;
  ulong uVar14;
  ulong uVar15;
  char **optionsp_00;
  ulong uVar16;
  undefined7 in_register_00000089;
  ulong uVar17;
  long lVar18;
  char *passwdp;
  char *userp;
  undefined8 uStack_50;
  char *optionsp;
  Curl_URL *local_40;
  uint local_38;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000089,has_scheme);
  userp = (char *)0x0;
  passwdp = (char *)0x0;
  optionsp = (char *)0x0;
  pvVar8 = memchr(auth,0x40,authlen);
  local_40 = u;
  if (pvVar8 == (void *)0x0) {
    CVar6 = CURLUE_OK;
    pcVar10 = (char *)0x0;
LAB_001600e1:
    (*Curl_cfree)(pcVar10);
    (*Curl_cfree)(passwdp);
    (*Curl_cfree)(optionsp);
    local_40->options = (char *)0x0;
    local_40->user = (char *)0x0;
    local_40->password = (char *)0x0;
    if (pvVar8 != (void *)0x0) {
      return CVar6;
    }
    lVar18 = 0;
  }
  else {
    local_38 = flags;
    if (u->scheme == (char *)0x0) {
      lVar18 = (long)pvVar8 + (1 - (long)auth);
LAB_001600ba:
      optionsp_00 = (char **)0x0;
    }
    else {
      pCVar9 = Curl_get_scheme_handler(u->scheme);
      lVar18 = (long)pvVar8 + (1 - (long)auth);
      if (pCVar9 == (Curl_handler *)0x0) goto LAB_001600ba;
      optionsp_00 = &optionsp;
      if ((pCVar9->flags & 0x400) == 0) {
        optionsp_00 = (char **)0x0;
      }
    }
    CVar4 = Curl_parse_login_details(auth,lVar18 - 1,&userp,&passwdp,optionsp_00);
    pCVar3 = local_40;
    pcVar10 = userp;
    if (CVar4 != CURLE_OK) {
      CVar6 = CURLUE_BAD_LOGIN;
      goto LAB_001600e1;
    }
    if (userp != (char *)0x0) {
      if ((local_38 & 0x20) != 0) {
        CVar6 = CURLUE_USER_NOT_ALLOWED;
        goto LAB_001600e1;
      }
      (*Curl_cfree)(local_40->user);
      pCVar3->user = userp;
    }
    if (passwdp != (char *)0x0) {
      (*Curl_cfree)(pCVar3->password);
      pCVar3->password = passwdp;
    }
    if (optionsp != (char *)0x0) {
      (*Curl_cfree)(pCVar3->options);
      pCVar3->options = optionsp;
    }
  }
  CVar4 = Curl_dyn_addn(host,auth + lVar18,authlen - lVar18);
  if (CVar4 != CURLE_OK) goto LAB_001601a2;
  pcVar10 = Curl_dyn_ptr(host);
  if (*pcVar10 == '[') {
    pcVar11 = strchr(pcVar10,0x5d);
    if (pcVar11 == (char *)0x0) {
      return CURLUE_BAD_IPV6;
    }
    if (pcVar11[1] != '\0') {
      if (pcVar11[1] != ':') {
        return CURLUE_BAD_PORT_NUMBER;
      }
      pcVar11 = pcVar11 + 1;
LAB_00160202:
      Curl_dyn_setlen(host,(long)pcVar11 - (long)pcVar10);
      userp = pcVar11 + 1;
      if (pcVar11[1] == '\0') {
        if ((char)local_34 == '\0') {
          return CURLUE_BAD_PORT_NUMBER;
        }
      }
      else {
        iVar5 = Curl_str_number(&userp,(curl_off_t *)&passwdp,0xffff);
        pCVar3 = local_40;
        if ((iVar5 != 0) || (*userp != '\0')) {
          return CURLUE_BAD_PORT_NUMBER;
        }
        local_40->portnum = (unsigned_short)passwdp;
        (*Curl_cfree)(local_40->port);
        pcVar10 = curl_maprintf("%ld",passwdp);
        pCVar3->port = pcVar10;
        if (pcVar10 == (char *)0x0) {
          return CURLUE_OUT_OF_MEMORY;
        }
      }
    }
  }
  else {
    pcVar11 = strchr(pcVar10,0x3a);
    if (pcVar11 != (char *)0x0) goto LAB_00160202;
  }
  sVar12 = Curl_dyn_len(host);
  pCVar3 = local_40;
  if (sVar12 == 0) {
    return CURLUE_NO_HOST;
  }
  passwdp = Curl_dyn_ptr(host);
  userp = (char *)0x0;
  uStack_50 = 0;
  if (*passwdp == '[') {
    pcVar10 = Curl_dyn_ptr(host);
    sVar12 = Curl_dyn_len(host);
    CVar6 = ipv6_parse(pCVar3,pcVar10,sVar12);
    return CVar6;
  }
  bVar13 = false;
  iVar5 = 0;
  while (uVar16 = uStack_50, pcVar10 = userp, !bVar13) {
    if (*passwdp == '0') {
      if (passwdp[1] == 'x') {
        passwdp = passwdp + 2;
        iVar7 = Curl_str_hex(&passwdp,(curl_off_t *)&optionsp,0xffffffff);
      }
      else {
        iVar7 = Curl_str_octal(&passwdp,(curl_off_t *)&optionsp,0xffffffff);
      }
    }
    else {
      iVar7 = Curl_str_number(&passwdp,(curl_off_t *)&optionsp,0xffffffff);
    }
    if (iVar7 != 0) goto LAB_001604cc;
    *(undefined4 *)((long)&userp + (long)iVar5 * 4) = optionsp._0_4_;
    bVar13 = true;
    if (*passwdp != '\0') {
      if ((*passwdp != '.') || (iVar5 == 3)) goto LAB_001604cc;
      iVar5 = iVar5 + 1;
      passwdp = passwdp + 1;
      bVar13 = false;
    }
  }
  uVar1 = userp._4_4_;
  uVar2 = (uint)uStack_50;
  switch(iVar5) {
  case 0:
    Curl_dyn_reset(host);
    uVar15 = (ulong)((uint)userp >> 0x18);
    uVar14 = (ulong)((uint)userp >> 0x10 & 0xff);
    uVar16 = (ulong)((uint)userp >> 8 & 0xff);
    uVar17 = (ulong)((uint)userp & 0xff);
    break;
  case 1:
    if (0xffffff < userp._4_4_ || 0xff < (uint)userp) {
LAB_001604cc:
      pcVar10 = Curl_dyn_ptr(host);
      pcVar11 = strchr(pcVar10,0x25);
      pCVar3 = local_40;
      if (pcVar11 != (char *)0x0) {
        CVar4 = Curl_urldecode(pcVar10,0,&passwdp,(size_t *)&userp,REJECT_CTRL);
        if (CVar4 != CURLE_OK) {
          return CURLUE_BAD_HOSTNAME;
        }
        Curl_dyn_reset(host);
        CVar4 = Curl_dyn_addn(host,passwdp,(size_t)userp);
        (*Curl_cfree)(passwdp);
        if (CVar4 != CURLE_OK) {
LAB_001601a2:
          if (CVar4 == CURLE_TOO_LARGE) {
            return CURLUE_TOO_LARGE;
          }
          return CURLUE_OUT_OF_MEMORY;
        }
      }
      pcVar10 = Curl_dyn_ptr(host);
      sVar12 = Curl_dyn_len(host);
      CVar6 = hostname_check(pCVar3,pcVar10,sVar12);
      return CVar6;
    }
    Curl_dyn_reset(host);
    uVar14 = (ulong)(uVar1 >> 0x10);
    uVar16 = (ulong)(uVar1 >> 8 & 0xff);
    uVar15 = (ulong)pcVar10 & 0xffffffff;
    uVar17 = (ulong)(uVar1 & 0xff);
    break;
  case 2:
    if (0xffff < (uint)uStack_50 || (0xff < userp._4_4_ || 0xff < (uint)userp)) goto LAB_001604cc;
    Curl_dyn_reset(host);
    uVar16 = (ulong)(uVar2 >> 8);
    uVar17 = (ulong)(uVar2 & 0xff);
    uVar15 = (ulong)pcVar10 & 0xffffffff;
    uVar14 = (ulong)uVar1;
    break;
  case 3:
    uVar2 = uStack_50._4_4_;
    if ((0xff < uStack_50._4_4_ || 0xff < (uint)uStack_50) ||
        (0xff < userp._4_4_ || 0xff < (uint)userp)) goto LAB_001604cc;
    Curl_dyn_reset(host);
    uVar15 = (ulong)pcVar10 & 0xffffffff;
    uVar14 = (ulong)uVar1;
    uVar16 = uVar16 & 0xffffffff;
    uVar17 = (ulong)uVar2;
    break;
  default:
    goto switchD_001603c0_default;
  }
  CVar4 = Curl_dyn_addf(host,"%u.%u.%u.%u",uVar15,uVar14,uVar16,uVar17);
  if (CVar4 == CURLE_OK) {
switchD_001603c0_default:
    CVar6 = CURLUE_OK;
  }
  else {
    CVar6 = CURLUE_OUT_OF_MEMORY;
  }
  return CVar6;
}

Assistant:

static CURLUcode parse_authority(struct Curl_URL *u,
                                 const char *auth, size_t authlen,
                                 unsigned int flags,
                                 struct dynbuf *host,
                                 bool has_scheme)
{
  size_t offset;
  CURLUcode uc;
  CURLcode result;

  /*
   * Parse the login details and strip them out of the hostname.
   */
  uc = parse_hostname_login(u, auth, authlen, flags, &offset);
  if(uc)
    goto out;

  result = Curl_dyn_addn(host, auth + offset, authlen - offset);
  if(result) {
    uc = cc2cu(result);
    goto out;
  }

  uc = Curl_parse_port(u, host, has_scheme);
  if(uc)
    goto out;

  if(!Curl_dyn_len(host))
    return CURLUE_NO_HOST;

  switch(ipv4_normalize(host)) {
  case HOST_IPV4:
    break;
  case HOST_IPV6:
    uc = ipv6_parse(u, Curl_dyn_ptr(host), Curl_dyn_len(host));
    break;
  case HOST_NAME:
    uc = urldecode_host(host);
    if(!uc)
      uc = hostname_check(u, Curl_dyn_ptr(host), Curl_dyn_len(host));
    break;
  case HOST_ERROR:
    uc = CURLUE_OUT_OF_MEMORY;
    break;
  default:
    uc = CURLUE_BAD_HOSTNAME; /* Bad IPv4 address even */
    break;
  }

out:
  return uc;
}